

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Value *pVVar4;
  BuiltStyledStreamWriter *this_00;
  Value *this_01;
  Enum cs;
  allocator local_c1;
  string colonSymbol;
  string nullSymbol;
  string endingLineFeedSymbol;
  string cs_str;
  string indentation;
  
  this_01 = &this->settings_;
  pVVar4 = Value::operator[](this_01,"indentation");
  Value::asString_abi_cxx11_(&indentation,pVVar4);
  pVVar4 = Value::operator[](this_01,"commentStyle");
  Value::asString_abi_cxx11_(&cs_str,pVVar4);
  pVVar4 = Value::operator[](this_01,"enableYAMLCompatibility");
  bVar1 = Value::asBool(pVVar4);
  pVVar4 = Value::operator[](this_01,"dropNullPlaceholders");
  bVar2 = Value::asBool(pVVar4);
  bVar3 = std::operator==(&cs_str,"All");
  if (!bVar3) {
    bVar3 = std::operator==(&cs_str,"None");
    cs = None;
    if (bVar3) goto LAB_001483af;
    std::__cxx11::string::string
              ((string *)&colonSymbol,"commentStyle must be \'All\' or \'None\'",
               (allocator *)&nullSymbol);
    throwRuntimeError(&colonSymbol);
    std::__cxx11::string::~string((string *)&colonSymbol);
  }
  cs = All;
LAB_001483af:
  std::__cxx11::string::string((string *)&colonSymbol," : ",(allocator *)&nullSymbol);
  if ((bVar1) || (indentation._M_string_length == 0)) {
    std::__cxx11::string::assign((char *)&colonSymbol);
  }
  std::__cxx11::string::string((string *)&nullSymbol,"null",(allocator *)&endingLineFeedSymbol);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&nullSymbol);
  }
  std::__cxx11::string::string((string *)&endingLineFeedSymbol,"",&local_c1);
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe0);
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&indentation,cs,&colonSymbol,&nullSymbol,&endingLineFeedSymbol);
  std::__cxx11::string::~string((string *)&endingLineFeedSymbol);
  std::__cxx11::string::~string((string *)&nullSymbol);
  std::__cxx11::string::~string((string *)&colonSymbol);
  std::__cxx11::string::~string((string *)&cs_str);
  std::__cxx11::string::~string((string *)&indentation);
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const
{
  std::string indentation = settings_["indentation"].asString();
  std::string cs_str = settings_["commentStyle"].asString();
  bool eyc = settings_["enableYAMLCompatibility"].asBool();
  bool dnp = settings_["dropNullPlaceholders"].asBool();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  std::string colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  std::string nullSymbol = "null";
  if (dnp) {
    nullSymbol = "";
  }
  std::string endingLineFeedSymbol = "";
  return new BuiltStyledStreamWriter(
      indentation, cs,
      colonSymbol, nullSymbol, endingLineFeedSymbol);
}